

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ulong uVar4;
  pointer ppVar5;
  ostream *poVar6;
  PolicyID id;
  undefined1 local_270 [7];
  bool result;
  string var;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  ostringstream e;
  iterator iStack_88;
  PolicyStatus status;
  _Self local_80;
  iterator it;
  string mfile;
  bool system;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string module;
  bool *found_local;
  cmFindPackageCommand *this_local;
  
  module.field_2._8_8_ = found;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"Find",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::operator+=((string *)local_40,(string *)&this->Name);
  std::__cxx11::string::operator+=((string *)local_40,".cmake");
  mfile.field_2._M_local_buf[0xb] = '\0';
  cmMakefile::GetModulesFile
            ((string *)&it,(this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_40,
             (bool *)(mfile.field_2._M_local_buf + 0xb));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    if ((mfile.field_2._M_local_buf[0xb] & 1U) != 0) {
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
           ::find(&this->DeprecatedFindModules,&this->Name);
      iStack_88 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                  ::end(&this->DeprecatedFindModules);
      bVar2 = std::operator!=(&local_80,&stack0xffffffffffffff78);
      if (bVar2) {
        pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                 ::operator->(&local_80);
        PVar3 = cmMakefile::GetPolicyStatus(pcVar1,ppVar5->second,false);
        if (PVar3 != OLD) {
          if (PVar3 == WARN) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                     ::operator->(&local_80);
            cmPolicies::GetPolicyWarning_abi_cxx11_
                      (&local_228,(cmPolicies *)(ulong)ppVar5->second,id);
            poVar6 = std::operator<<((ostream *)local_208,(string *)&local_228);
            std::operator<<(poVar6,"\n");
            std::__cxx11::string::~string((string *)&local_228);
            pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_248);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
          }
          else if (PVar3 - NEW < 3) {
            this_local._7_1_ = true;
            var.field_2._12_4_ = 1;
            goto LAB_0018f4c9;
          }
        }
      }
    }
    *(undefined1 *)module.field_2._8_8_ = 1;
    std::__cxx11::string::string((string *)local_270,(string *)&this->Name);
    std::__cxx11::string::operator+=((string *)local_270,"_FIND_MODULE");
    cmMakefile::AddDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_270,"1");
    this_local._7_1_ = ReadListFile(this,(string *)&it,DoPolicyScope);
    cmMakefile::RemoveDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_270);
    var.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_270);
  }
  else {
    this_local._7_1_ = true;
    var.field_2._12_4_ = 1;
  }
LAB_0018f4c9:
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string module = "Find";
  module += this->Name;
  module += ".cmake";
  bool system = false;
  std::string mfile = this->Makefile->GetModulesFile(module, system);
  if (!mfile.empty()) {
    if (system) {
      auto it = this->DeprecatedFindModules.find(this->Name);
      if (it != this->DeprecatedFindModules.end()) {
        cmPolicies::PolicyStatus status =
          this->Makefile->GetPolicyStatus(it->second);
        switch (status) {
          case cmPolicies::WARN: {
            std::ostringstream e;
            e << cmPolicies::GetPolicyWarning(it->second) << "\n";
            this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            return true;
        }
      }
    }

    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string var = this->Name;
    var += "_FIND_MODULE";
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile, DoPolicyScope);
    this->Makefile->RemoveDefinition(var);
    return result;
  }
  return true;
}